

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDec.c
# Opt level: O1

Abc_Obj_t *
Lpk_Decompose(Lpk_Man_t *p,Abc_Ntk_t *pNtk,Vec_Ptr_t *vLeaves,uint *pTruth,uint *puSupps,int nLutK,
             int AreaLim,int DelayLim)

{
  int nLeavesOld;
  int iVar1;
  Lpk_Fun_t *p_00;
  Abc_Obj_t *pAVar2;
  
  nLeavesOld = vLeaves->nSize;
  p_00 = Lpk_FunCreate(pNtk,vLeaves,pTruth,nLutK,AreaLim,DelayLim);
  if ((*puSupps != 0) || (puSupps[1] != 0)) {
    memcpy(p_00->puSupps,puSupps,(long)nLeavesOld * 8);
    p_00->field_0xb = p_00->field_0xb | 0x40;
  }
  Lpk_FunSuppMinimize(p_00);
  if ((*(uint *)&p_00->field_0x8 >> 0xc & 0xf) < (*(uint *)&p_00->field_0x8 >> 7 & 0x1f)) {
    iVar1 = Lpk_Decompose_rec(p,p_00);
    if (iVar1 == 0) {
      pAVar2 = (Abc_Obj_t *)0x0;
    }
    else {
      pAVar2 = Lpk_Implement(p,pNtk,vLeaves,nLeavesOld);
    }
  }
  else {
    pAVar2 = Lpk_ImplementFun(p,pNtk,vLeaves,p_00);
  }
  Lpk_DecomposeClean(vLeaves,nLeavesOld);
  return pAVar2;
}

Assistant:

Abc_Obj_t * Lpk_Decompose( Lpk_Man_t * p, Abc_Ntk_t * pNtk, Vec_Ptr_t * vLeaves, unsigned * pTruth, unsigned * puSupps, int nLutK, int AreaLim, int DelayLim )
{
    Lpk_Fun_t * pFun;
    Abc_Obj_t * pObjNew = NULL;
    int nLeaves = Vec_PtrSize( vLeaves );
    pFun = Lpk_FunCreate( pNtk, vLeaves, pTruth, nLutK, AreaLim, DelayLim );
    if ( puSupps[0] || puSupps[1] )
    {
/*
        int i;
        Lpk_FunComputeCofSupps( pFun );
        for ( i = 0; i < nLeaves; i++ )
        {
            assert( pFun->puSupps[2*i+0] == puSupps[2*i+0] );
            assert( pFun->puSupps[2*i+1] == puSupps[2*i+1] );
        }
*/
        memcpy( pFun->puSupps, puSupps, sizeof(unsigned) * 2 * nLeaves );
        pFun->fSupports = 1;
    }
    Lpk_FunSuppMinimize( pFun );
    if ( pFun->nVars <= pFun->nLutK )
        pObjNew = Lpk_ImplementFun( p, pNtk, vLeaves, pFun );
    else if ( Lpk_Decompose_rec(p, pFun) )
        pObjNew = Lpk_Implement( p, pNtk, vLeaves, nLeaves );
    Lpk_DecomposeClean( vLeaves, nLeaves );
    return pObjNew;
}